

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artitele.cpp
# Opt level: O1

bool P_AutoUseChaosDevice(player_t *player)

{
  APlayerPawn *this;
  int iVar1;
  PClassActor *type;
  AInventory *pAVar2;
  
  this = player->mo;
  type = PClass::FindActor("ArtiTeleport");
  pAVar2 = AActor::FindInventory(&this->super_AActor,type,false);
  if (pAVar2 != (AInventory *)0x0) {
    (*(player->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x1d])
              (player->mo,pAVar2);
    iVar1 = (player->health - (player->health + 1 >> 0x1f)) + 1 >> 1;
    (player->mo->super_AActor).health = iVar1;
    player->health = iVar1;
  }
  return pAVar2 != (AInventory *)0x0;
}

Assistant:

bool P_AutoUseChaosDevice (player_t *player)
{
	AInventory *arti = player->mo->FindInventory(PClass::FindActor("ArtiTeleport"));

	if (arti != NULL)
	{
		player->mo->UseInventory (arti);
		player->health = player->mo->health = (player->health+1)/2;
		return true;
	}
	return false;
}